

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O0

size_t __thiscall proto2_nofieldpresence_unittest::TestAllTypes::ByteSizeLong(TestAllTypes *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  uint32_t uVar5;
  uint uVar6;
  TestAllTypes_NestedEnum TVar7;
  ForeignEnum FVar8;
  OneofFieldCase OVar9;
  RepeatedField<int> *pRVar10;
  size_t sVar11;
  RepeatedField<long> *pRVar12;
  size_t sVar13;
  RepeatedField<unsigned_int> *value;
  size_t sVar14;
  RepeatedField<unsigned_long> *value_00;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar25;
  size_t sVar26;
  const_reference pbVar27;
  RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *pRVar28;
  reference value_01;
  RepeatedPtrField<proto2_nofieldpresence_unittest::ForeignMessage> *this_00;
  reference value_02;
  RepeatedPtrField<proto2_unittest::TestAllTypes> *this_01;
  reference value_03;
  uint32_t *puVar29;
  ulong uVar30;
  string *psVar31;
  int64_t iVar32;
  uint64_t uVar33;
  unsigned_long uVar34;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  double local_180;
  float local_174;
  reference local_170;
  TestAllTypes_NestedMessage *msg_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *__range2_3;
  int n_3;
  int i_3;
  int n_2;
  int i_2;
  TestAllTypes *msg_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<proto2_unittest::TestAllTypes> *__range2_2;
  ForeignMessage *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<proto2_nofieldpresence_unittest::ForeignMessage> *__range2_1;
  TestAllTypes_NestedMessage *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage> *__range2;
  int n_1;
  int i_1;
  int n;
  int i;
  size_t tag_size_6;
  size_t data_size_6;
  size_t tag_size_5;
  size_t data_size_5;
  size_t tag_size_4;
  size_t data_size_4;
  size_t tag_size_3;
  size_t data_size_3;
  size_t tag_size_2;
  size_t data_size_2;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestAllTypes *this_;
  TestAllTypes *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar10 = _internal_repeated_int32(this);
  sVar11 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                     (pRVar10,2,&(this->field_0)._impl_._repeated_int32_cached_byte_size_);
  pRVar12 = _internal_repeated_int64(this);
  sVar13 = google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                     (pRVar12,2,&(this->field_0)._impl_._repeated_int64_cached_byte_size_);
  value = _internal_repeated_uint32(this);
  sVar14 = google::protobuf::internal::WireFormatLite::UInt32SizeWithPackedTagSize
                     (value,2,&(this->field_0)._impl_._repeated_uint32_cached_byte_size_);
  value_00 = _internal_repeated_uint64(this);
  sVar15 = google::protobuf::internal::WireFormatLite::UInt64SizeWithPackedTagSize
                     (value_00,2,&(this->field_0)._impl_._repeated_uint64_cached_byte_size_);
  pRVar10 = _internal_repeated_sint32(this);
  sVar16 = google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                     (pRVar10,2,&(this->field_0)._impl_._repeated_sint32_cached_byte_size_);
  pRVar12 = _internal_repeated_sint64(this);
  sVar17 = google::protobuf::internal::WireFormatLite::SInt64SizeWithPackedTagSize
                     (pRVar12,2,&(this->field_0)._impl_._repeated_sint64_cached_byte_size_);
  iVar3 = _internal_repeated_fixed32_size(this);
  sVar18 = google::protobuf::internal::FromIntSize(iVar3);
  lVar19 = sVar18 * 4;
  if (lVar19 == 0) {
    local_188 = 0;
  }
  else {
    sVar18 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar19);
    local_188 = sVar18 + 2;
  }
  iVar3 = _internal_repeated_fixed64_size(this);
  sVar18 = google::protobuf::internal::FromIntSize(iVar3);
  lVar20 = sVar18 * 8;
  if (lVar20 == 0) {
    local_190 = 0;
  }
  else {
    sVar18 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar20);
    local_190 = sVar18 + 2;
  }
  iVar3 = _internal_repeated_sfixed32_size(this);
  sVar18 = google::protobuf::internal::FromIntSize(iVar3);
  lVar21 = sVar18 * 4;
  if (lVar21 == 0) {
    local_198 = 0;
  }
  else {
    sVar18 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar21);
    local_198 = sVar18 + 2;
  }
  iVar3 = _internal_repeated_sfixed64_size(this);
  sVar18 = google::protobuf::internal::FromIntSize(iVar3);
  lVar22 = sVar18 * 8;
  if (lVar22 == 0) {
    local_1a0 = 0;
  }
  else {
    sVar18 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar22);
    local_1a0 = sVar18 + 2;
  }
  iVar3 = _internal_repeated_float_size(this);
  sVar18 = google::protobuf::internal::FromIntSize(iVar3);
  lVar23 = sVar18 * 4;
  if (lVar23 == 0) {
    local_1a8 = 0;
  }
  else {
    sVar18 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar23);
    local_1a8 = sVar18 + 2;
  }
  iVar3 = _internal_repeated_double_size(this);
  sVar18 = google::protobuf::internal::FromIntSize(iVar3);
  lVar24 = sVar18 * 8;
  if (lVar24 == 0) {
    local_1b0 = 0;
  }
  else {
    sVar18 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar24);
    local_1b0 = sVar18 + 2;
  }
  iVar3 = _internal_repeated_bool_size(this);
  sVar18 = google::protobuf::internal::FromIntSize(iVar3);
  if (sVar18 == 0) {
    local_1b8 = 0;
  }
  else {
    sVar26 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar18);
    local_1b8 = sVar26 + 2;
  }
  pRVar25 = _internal_repeated_string_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar25);
  sVar26 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar26 * 2 +
              local_1b8 + sVar18 +
              local_1b0 + lVar24 +
              local_1a8 + lVar23 +
              local_1a0 + lVar22 +
              local_198 + lVar21 +
              local_190 + lVar20 +
              local_188 + lVar19 + sVar17 + sVar16 + sVar15 + sVar14 + sVar13 + sVar11;
  i_1 = 0;
  pRVar25 = _internal_repeated_string_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar25);
  for (; i_1 < iVar3; i_1 = i_1 + 1) {
    pRVar25 = _internal_repeated_string_abi_cxx11_(this);
    pbVar27 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar25,i_1);
    sVar11 = google::protobuf::internal::WireFormatLite::StringSize(pbVar27);
    sStack_58 = sVar11 + sStack_58;
  }
  pRVar25 = _internal_repeated_bytes_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar25);
  sVar11 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar11 * 2 + sStack_58;
  __range2._4_4_ = 0;
  pRVar25 = _internal_repeated_bytes_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar25);
  for (; __range2._4_4_ < iVar3; __range2._4_4_ = __range2._4_4_ + 1) {
    pRVar25 = _internal_repeated_bytes_abi_cxx11_(this);
    pbVar27 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar25,__range2._4_4_);
    sVar11 = google::protobuf::internal::WireFormatLite::BytesSize(pbVar27);
    sStack_58 = sVar11 + sStack_58;
  }
  iVar3 = _internal_repeated_nested_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  pRVar28 = _internal_repeated_nested_message(this);
  __end2 = google::protobuf::
           RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>::begin
                     (pRVar28);
  msg = (TestAllTypes_NestedMessage *)
        google::protobuf::
        RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>::end(pRVar28);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    value_01 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>
               ::operator*(&__end2);
    sVar11 = google::protobuf::internal::WireFormatLite::
             MessageSize<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>(value_01);
    sStack_58 = sVar11 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>::
    operator++(&__end2);
  }
  iVar3 = _internal_repeated_foreign_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  this_00 = _internal_repeated_foreign_message(this);
  __end2_1 = google::protobuf::RepeatedPtrField<proto2_nofieldpresence_unittest::ForeignMessage>::
             begin(this_00);
  msg_1 = (ForeignMessage *)
          google::protobuf::RepeatedPtrField<proto2_nofieldpresence_unittest::ForeignMessage>::end
                    (this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_1,(iterator *)&msg_1), bVar2) {
    value_02 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto2_nofieldpresence_unittest::ForeignMessage>::operator*
                         (&__end2_1);
    sVar11 = google::protobuf::internal::WireFormatLite::
             MessageSize<proto2_nofieldpresence_unittest::ForeignMessage>(value_02);
    sStack_58 = sVar11 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_nofieldpresence_unittest::ForeignMessage>::operator++
              (&__end2_1);
  }
  iVar3 = _internal_repeated_proto2_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  this_01 = _internal_repeated_proto2_message(this);
  __end2_2 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes>::begin(this_01);
  msg_2 = (TestAllTypes *)
          google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypes>::end(this_01);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_2,(iterator *)&msg_2), bVar2) {
    value_03 = google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::TestAllTypes>
               ::operator*(&__end2_2);
    sVar11 = google::protobuf::internal::WireFormatLite::MessageSize<proto2_unittest::TestAllTypes>
                       (value_03);
    sStack_58 = sVar11 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::TestAllTypes>::operator++
              (&__end2_2);
  }
  pRVar10 = _internal_repeated_nested_enum(this);
  sVar11 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (pRVar10,2,&(this->field_0)._impl_._repeated_nested_enum_cached_byte_size_);
  pRVar10 = _internal_repeated_foreign_enum(this);
  sVar13 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (pRVar10,2,&(this->field_0)._impl_._repeated_foreign_enum_cached_byte_size_);
  pRVar25 = _internal_repeated_string_piece_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar25);
  sVar14 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar14 * 2 + sVar13 + sVar11 + sStack_58;
  i_3 = 0;
  pRVar25 = _internal_repeated_string_piece_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar25);
  for (; i_3 < iVar3; i_3 = i_3 + 1) {
    pRVar25 = _internal_repeated_string_piece_abi_cxx11_(this);
    pbVar27 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar25,i_3);
    sVar11 = google::protobuf::internal::WireFormatLite::StringSize(pbVar27);
    sStack_58 = sVar11 + sStack_58;
  }
  pRVar25 = _internal_repeated_cord_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar25);
  sVar11 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar11 * 2 + sStack_58;
  __range2_3._4_4_ = 0;
  pRVar25 = _internal_repeated_cord_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar25);
  for (; __range2_3._4_4_ < iVar3; __range2_3._4_4_ = __range2_3._4_4_ + 1) {
    pRVar25 = _internal_repeated_cord_abi_cxx11_(this);
    pbVar27 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar25,__range2_3._4_4_);
    sVar11 = google::protobuf::internal::WireFormatLite::StringSize(pbVar27);
    sStack_58 = sVar11 + sStack_58;
  }
  iVar3 = _internal_repeated_lazy_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  pRVar28 = _internal_repeated_lazy_message(this);
  __end2_3 = google::protobuf::
             RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>::begin
                       (pRVar28);
  msg_3 = (TestAllTypes_NestedMessage *)
          google::protobuf::
          RepeatedPtrField<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>::end
                    (pRVar28);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_3,(iterator *)&msg_3), bVar2) {
    local_170 = google::protobuf::internal::
                RepeatedPtrIterator<const_proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>
                ::operator*(&__end2_3);
    sVar11 = google::protobuf::internal::WireFormatLite::
             MessageSize<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>(local_170);
    sStack_58 = sVar11 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>::
    operator++(&__end2_3);
  }
  puVar29 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0)
  ;
  uVar1 = *puVar29;
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_optional_string_abi_cxx11_(this);
      uVar30 = std::__cxx11::string::empty();
      if ((uVar30 & 1) == 0) {
        psVar31 = _internal_optional_string_abi_cxx11_(this);
        sVar11 = google::protobuf::internal::WireFormatLite::StringSize(psVar31);
        sStack_58 = sVar11 + 1 + sStack_58;
      }
    }
    if ((uVar1 & 2) != 0) {
      _internal_optional_bytes_abi_cxx11_(this);
      uVar30 = std::__cxx11::string::empty();
      if ((uVar30 & 1) == 0) {
        psVar31 = _internal_optional_bytes_abi_cxx11_(this);
        sVar11 = google::protobuf::internal::WireFormatLite::BytesSize(psVar31);
        sStack_58 = sVar11 + 1 + sStack_58;
      }
    }
    if ((uVar1 & 4) != 0) {
      _internal_optional_string_piece_abi_cxx11_(this);
      uVar30 = std::__cxx11::string::empty();
      if ((uVar30 & 1) == 0) {
        psVar31 = _internal_optional_string_piece_abi_cxx11_(this);
        sVar11 = google::protobuf::internal::WireFormatLite::StringSize(psVar31);
        sStack_58 = sVar11 + 2 + sStack_58;
      }
    }
    if ((uVar1 & 8) != 0) {
      _internal_optional_cord_abi_cxx11_(this);
      uVar30 = std::__cxx11::string::empty();
      if ((uVar30 & 1) == 0) {
        psVar31 = _internal_optional_cord_abi_cxx11_(this);
        sVar11 = google::protobuf::internal::WireFormatLite::StringSize(psVar31);
        sStack_58 = sVar11 + 2 + sStack_58;
      }
    }
    if ((uVar1 & 0x10) != 0) {
      sVar11 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>
                         ((this->field_0)._impl_.optional_nested_message_);
      sStack_58 = sVar11 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar11 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_nofieldpresence_unittest::ForeignMessage>
                         ((this->field_0)._impl_.optional_foreign_message_);
      sStack_58 = sVar11 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      sVar11 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_unittest::TestAllTypes>
                         ((this->field_0)._impl_.optional_proto2_message_);
      sStack_58 = sVar11 + 2 + sStack_58;
    }
    if ((uVar1 & 0x80) != 0) {
      sVar11 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>
                         ((this->field_0)._impl_.optional_lazy_message_);
      sStack_58 = sVar11 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if (((uVar1 & 0x100) != 0) && (iVar32 = _internal_optional_int64(this), iVar32 != 0)) {
      iVar32 = _internal_optional_int64(this);
      sVar11 = google::protobuf::internal::WireFormatLite::Int64SizePlusOne(iVar32);
      sStack_58 = sVar11 + sStack_58;
    }
    if (((uVar1 & 0x200) != 0) && (iVar4 = _internal_optional_int32(this), iVar4 != 0)) {
      iVar4 = _internal_optional_int32(this);
      sVar11 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar4);
      sStack_58 = sVar11 + sStack_58;
    }
    if (((uVar1 & 0x400) != 0) && (uVar5 = _internal_optional_uint32(this), uVar5 != 0)) {
      uVar5 = _internal_optional_uint32(this);
      sVar11 = google::protobuf::internal::WireFormatLite::UInt32SizePlusOne(uVar5);
      sStack_58 = sVar11 + sStack_58;
    }
    if (((uVar1 & 0x800) != 0) && (uVar33 = _internal_optional_uint64(this), uVar33 != 0)) {
      uVar33 = _internal_optional_uint64(this);
      sVar11 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar33);
      sStack_58 = sVar11 + sStack_58;
    }
    if (((uVar1 & 0x1000) != 0) && (iVar32 = _internal_optional_sint64(this), iVar32 != 0)) {
      iVar32 = _internal_optional_sint64(this);
      sVar11 = google::protobuf::internal::WireFormatLite::SInt64SizePlusOne(iVar32);
      sStack_58 = sVar11 + sStack_58;
    }
    if (((uVar1 & 0x2000) != 0) && (iVar4 = _internal_optional_sint32(this), iVar4 != 0)) {
      iVar4 = _internal_optional_sint32(this);
      sVar11 = google::protobuf::internal::WireFormatLite::SInt32SizePlusOne(iVar4);
      sStack_58 = sVar11 + sStack_58;
    }
    if (((uVar1 & 0x4000) != 0) && (uVar5 = _internal_optional_fixed32(this), uVar5 != 0)) {
      sStack_58 = sStack_58 + 5;
    }
    if (((uVar1 & 0x8000) != 0) && (uVar33 = _internal_optional_fixed64(this), uVar33 != 0)) {
      sStack_58 = sStack_58 + 9;
    }
  }
  if ((uVar1 & 0x7f0000) != 0) {
    if (((uVar1 & 0x10000) != 0) && (iVar32 = _internal_optional_sfixed64(this), iVar32 != 0)) {
      sStack_58 = sStack_58 + 9;
    }
    if (((uVar1 & 0x20000) != 0) && (iVar4 = _internal_optional_sfixed32(this), iVar4 != 0)) {
      sStack_58 = sStack_58 + 5;
    }
    if ((uVar1 & 0x40000) != 0) {
      local_174 = _internal_optional_float(this);
      uVar6 = absl::lts_20250127::bit_cast<unsigned_int,_float,_0>(&local_174);
      if (uVar6 != 0) {
        sStack_58 = sStack_58 + 5;
      }
    }
    if ((uVar1 & 0x80000) != 0) {
      local_180 = _internal_optional_double(this);
      uVar34 = absl::lts_20250127::bit_cast<unsigned_long,_double,_0>(&local_180);
      if (uVar34 != 0) {
        sStack_58 = sStack_58 + 9;
      }
    }
    if (((uVar1 & 0x100000) != 0) && (bVar2 = _internal_optional_bool(this), bVar2)) {
      sStack_58 = sStack_58 + 2;
    }
    if (((uVar1 & 0x200000) != 0) &&
       (TVar7 = _internal_optional_nested_enum(this), TVar7 != TestAllTypes_NestedEnum_FOO)) {
      TVar7 = _internal_optional_nested_enum(this);
      sVar11 = google::protobuf::internal::WireFormatLite::EnumSize(TVar7);
      sStack_58 = sVar11 + 2 + sStack_58;
    }
    if (((uVar1 & 0x400000) != 0) &&
       (FVar8 = _internal_optional_foreign_enum(this), FVar8 != FOREIGN_FOO)) {
      FVar8 = _internal_optional_foreign_enum(this);
      sVar11 = google::protobuf::internal::WireFormatLite::EnumSize(FVar8);
      sStack_58 = sVar11 + 2 + sStack_58;
    }
  }
  OVar9 = oneof_field_case(this);
  if (OVar9 != ONEOF_FIELD_NOT_SET) {
    if (OVar9 == kOneofUint32) {
      uVar5 = _internal_oneof_uint32(this);
      sVar11 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar5);
      sStack_58 = sVar11 + 2 + sStack_58;
    }
    else if (OVar9 == kOneofNestedMessage) {
      sVar11 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_nofieldpresence_unittest::TestAllTypes_NestedMessage>
                         ((this->field_0)._impl_.oneof_field_.oneof_nested_message_);
      sStack_58 = sVar11 + 2 + sStack_58;
    }
    else if (OVar9 == kOneofString) {
      psVar31 = _internal_oneof_string_abi_cxx11_(this);
      sVar11 = google::protobuf::internal::WireFormatLite::StringSize(psVar31);
      sStack_58 = sVar11 + 2 + sStack_58;
    }
    else if (OVar9 == kOneofEnum) {
      TVar7 = _internal_oneof_enum(this);
      sVar11 = google::protobuf::internal::WireFormatLite::EnumSize(TVar7);
      sStack_58 = sVar11 + 2 + sStack_58;
    }
  }
  sVar11 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                     (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar11;
}

Assistant:

::size_t TestAllTypes::ByteSizeLong() const {
  const TestAllTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_nofieldpresence_unittest.TestAllTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 31;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32(), 2,
              this_._impl_._repeated_int32_cached_byte_size_);
    }
    // repeated int64 repeated_int64 = 32;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int64SizeWithPackedTagSize(
              this_._internal_repeated_int64(), 2,
              this_._impl_._repeated_int64_cached_byte_size_);
    }
    // repeated uint32 repeated_uint32 = 33;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt32SizeWithPackedTagSize(
              this_._internal_repeated_uint32(), 2,
              this_._impl_._repeated_uint32_cached_byte_size_);
    }
    // repeated uint64 repeated_uint64 = 34;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt64SizeWithPackedTagSize(
              this_._internal_repeated_uint64(), 2,
              this_._impl_._repeated_uint64_cached_byte_size_);
    }
    // repeated sint32 repeated_sint32 = 35;
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt32SizeWithPackedTagSize(
              this_._internal_repeated_sint32(), 2,
              this_._impl_._repeated_sint32_cached_byte_size_);
    }
    // repeated sint64 repeated_sint64 = 36;
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt64SizeWithPackedTagSize(
              this_._internal_repeated_sint64(), 2,
              this_._impl_._repeated_sint64_cached_byte_size_);
    }
    // repeated fixed32 repeated_fixed32 = 37;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated fixed64 repeated_fixed64 = 38;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 repeated_sfixed32 = 39;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 repeated_sfixed64 = 40;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated float repeated_float = 41;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated double repeated_double = 42;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool = 43;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated string repeated_string = 44;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string().size());
      for (int i = 0, n = this_._internal_repeated_string().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string().Get(i));
      }
    }
    // repeated bytes repeated_bytes = 45;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_bytes().size());
      for (int i = 0, n = this_._internal_repeated_bytes().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::BytesSize(
            this_._internal_repeated_bytes().Get(i));
      }
    }
    // repeated .proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage repeated_nested_message = 48;
    {
      total_size += 2UL * this_._internal_repeated_nested_message_size();
      for (const auto& msg : this_._internal_repeated_nested_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_nofieldpresence_unittest.ForeignMessage repeated_foreign_message = 49;
    {
      total_size += 2UL * this_._internal_repeated_foreign_message_size();
      for (const auto& msg : this_._internal_repeated_foreign_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypes repeated_proto2_message = 50;
    {
      total_size += 2UL * this_._internal_repeated_proto2_message_size();
      for (const auto& msg : this_._internal_repeated_proto2_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_nofieldpresence_unittest.TestAllTypes.NestedEnum repeated_nested_enum = 51;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_nested_enum(), 2, this_._impl_._repeated_nested_enum_cached_byte_size_);
    }
    // repeated .proto2_nofieldpresence_unittest.ForeignEnum repeated_foreign_enum = 52;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_foreign_enum(), 2, this_._impl_._repeated_foreign_enum_cached_byte_size_);
    }
    // repeated string repeated_string_piece = 54 [ctype = STRING_PIECE];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_piece().size());
      for (int i = 0, n = this_._internal_repeated_string_piece().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_piece().Get(i));
      }
    }
    // repeated string repeated_cord = 55 [ctype = CORD];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_cord().size());
      for (int i = 0, n = this_._internal_repeated_cord().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_cord().Get(i));
      }
    }
    // repeated .proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage repeated_lazy_message = 57;
    {
      total_size += 2UL * this_._internal_repeated_lazy_message_size();
      for (const auto& msg : this_._internal_repeated_lazy_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // string optional_string = 14;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_optional_string().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_optional_string());
      }
    }
    // bytes optional_bytes = 15;
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!this_._internal_optional_bytes().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                        this_._internal_optional_bytes());
      }
    }
    // string optional_string_piece = 24 [ctype = STRING_PIECE];
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!this_._internal_optional_string_piece().empty()) {
        total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_optional_string_piece());
      }
    }
    // string optional_cord = 25 [ctype = CORD];
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (!this_._internal_optional_cord().empty()) {
        total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_optional_cord());
      }
    }
    // .proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage optional_nested_message = 18;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_message_);
    }
    // .proto2_nofieldpresence_unittest.ForeignMessage optional_foreign_message = 19;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_foreign_message_);
    }
    // .proto2_unittest.TestAllTypes optional_proto2_message = 20;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_proto2_message_);
    }
    // .proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage optional_lazy_message = 30 [lazy = true];
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_lazy_message_);
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // int64 optional_int64 = 2;
    if ((cached_has_bits & 0x00000100u) != 0) {
      if (this_._internal_optional_int64() != 0) {
        total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
            this_._internal_optional_int64());
      }
    }
    // int32 optional_int32 = 1;
    if ((cached_has_bits & 0x00000200u) != 0) {
      if (this_._internal_optional_int32() != 0) {
        total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
            this_._internal_optional_int32());
      }
    }
    // uint32 optional_uint32 = 3;
    if ((cached_has_bits & 0x00000400u) != 0) {
      if (this_._internal_optional_uint32() != 0) {
        total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
            this_._internal_optional_uint32());
      }
    }
    // uint64 optional_uint64 = 4;
    if ((cached_has_bits & 0x00000800u) != 0) {
      if (this_._internal_optional_uint64() != 0) {
        total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
            this_._internal_optional_uint64());
      }
    }
    // sint64 optional_sint64 = 6;
    if ((cached_has_bits & 0x00001000u) != 0) {
      if (this_._internal_optional_sint64() != 0) {
        total_size += ::_pbi::WireFormatLite::SInt64SizePlusOne(
            this_._internal_optional_sint64());
      }
    }
    // sint32 optional_sint32 = 5;
    if ((cached_has_bits & 0x00002000u) != 0) {
      if (this_._internal_optional_sint32() != 0) {
        total_size += ::_pbi::WireFormatLite::SInt32SizePlusOne(
            this_._internal_optional_sint32());
      }
    }
    // fixed32 optional_fixed32 = 7;
    if ((cached_has_bits & 0x00004000u) != 0) {
      if (this_._internal_optional_fixed32() != 0) {
        total_size += 5;
      }
    }
    // fixed64 optional_fixed64 = 8;
    if ((cached_has_bits & 0x00008000u) != 0) {
      if (this_._internal_optional_fixed64() != 0) {
        total_size += 9;
      }
    }
  }
  if ((cached_has_bits & 0x007f0000u) != 0) {
    // sfixed64 optional_sfixed64 = 10;
    if ((cached_has_bits & 0x00010000u) != 0) {
      if (this_._internal_optional_sfixed64() != 0) {
        total_size += 9;
      }
    }
    // sfixed32 optional_sfixed32 = 9;
    if ((cached_has_bits & 0x00020000u) != 0) {
      if (this_._internal_optional_sfixed32() != 0) {
        total_size += 5;
      }
    }
    // float optional_float = 11;
    if ((cached_has_bits & 0x00040000u) != 0) {
      if (::absl::bit_cast<::uint32_t>(this_._internal_optional_float()) != 0) {
        total_size += 5;
      }
    }
    // double optional_double = 12;
    if ((cached_has_bits & 0x00080000u) != 0) {
      if (::absl::bit_cast<::uint64_t>(this_._internal_optional_double()) != 0) {
        total_size += 9;
      }
    }
    // bool optional_bool = 13;
    if ((cached_has_bits & 0x00100000u) != 0) {
      if (this_._internal_optional_bool() != 0) {
        total_size += 2;
      }
    }
    // .proto2_nofieldpresence_unittest.TestAllTypes.NestedEnum optional_nested_enum = 21;
    if ((cached_has_bits & 0x00200000u) != 0) {
      if (this_._internal_optional_nested_enum() != 0) {
        total_size += 2 +
                      ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_nested_enum());
      }
    }
    // .proto2_nofieldpresence_unittest.ForeignEnum optional_foreign_enum = 22;
    if ((cached_has_bits & 0x00400000u) != 0) {
      if (this_._internal_optional_foreign_enum() != 0) {
        total_size += 2 +
                      ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_foreign_enum());
      }
    }
  }
  switch (this_.oneof_field_case()) {
    // uint32 oneof_uint32 = 111;
    case kOneofUint32: {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_oneof_uint32());
      break;
    }
    // .proto2_nofieldpresence_unittest.TestAllTypes.NestedMessage oneof_nested_message = 112;
    case kOneofNestedMessage: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_nested_message_);
      break;
    }
    // string oneof_string = 113;
    case kOneofString: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string());
      break;
    }
    // .proto2_nofieldpresence_unittest.TestAllTypes.NestedEnum oneof_enum = 114;
    case kOneofEnum: {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_oneof_enum());
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}